

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O2

int __thiscall Mpp::poll(Mpp *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  MppPort port;
  int iVar1;
  MPP_RET MVar2;
  long lStack_20;
  
  if (this->mInitDone == 0) {
    iVar1 = -0x3ea;
  }
  else {
    set_io_mode(this,MPP_IO_MODE_TASK);
    iVar1 = -1;
    if ((int)__fds == 0) {
      lStack_20 = 0x50;
    }
    else {
      if ((int)__fds != 1) {
        return -1;
      }
      lStack_20 = 0x58;
    }
    port = *(MppPort *)((long)&this->mPktIn + lStack_20);
    if (port != (MppPort)0x0) {
      MVar2 = _mpp_port_poll("poll",port,(MppPollType)__nfds);
      return MVar2;
    }
  }
  return iVar1;
}

Assistant:

MPP_RET Mpp::poll(MppPortType type, MppPollType timeout)
{
    if (!mInitDone)
        return MPP_ERR_INIT;

    MPP_RET ret = MPP_NOK;
    MppTaskQueue port = NULL;

    set_io_mode(MPP_IO_MODE_TASK);

    switch (type) {
    case MPP_PORT_INPUT : {
        port = mUsrInPort;
    } break;
    case MPP_PORT_OUTPUT : {
        port = mUsrOutPort;
    } break;
    default : {
    } break;
    }

    if (port)
        ret = mpp_port_poll(port, timeout);

    return ret;
}